

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.cpp
# Opt level: O0

ShaderType vk::getGluShaderType(VkShaderStageFlagBits shaderStage)

{
  ShaderType local_c;
  VkShaderStageFlagBits shaderStage_local;
  
  switch(shaderStage) {
  case VK_SHADER_STAGE_VERTEX_BIT:
    local_c = SHADERTYPE_VERTEX;
    break;
  case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
    local_c = SHADERTYPE_TESSELLATION_CONTROL;
    break;
  default:
    local_c = SHADERTYPE_LAST;
    break;
  case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
    local_c = SHADERTYPE_TESSELLATION_EVALUATION;
    break;
  case VK_SHADER_STAGE_GEOMETRY_BIT:
    local_c = SHADERTYPE_GEOMETRY;
    break;
  case VK_SHADER_STAGE_FRAGMENT_BIT:
    local_c = SHADERTYPE_FRAGMENT;
    break;
  case VK_SHADER_STAGE_COMPUTE_BIT:
    local_c = SHADERTYPE_COMPUTE;
  }
  return local_c;
}

Assistant:

glu::ShaderType getGluShaderType (VkShaderStageFlagBits shaderStage)
{
	switch (shaderStage)
	{
		case VK_SHADER_STAGE_VERTEX_BIT:					return glu::SHADERTYPE_VERTEX;
		case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:		return glu::SHADERTYPE_TESSELLATION_CONTROL;
		case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:	return glu::SHADERTYPE_TESSELLATION_EVALUATION;
		case VK_SHADER_STAGE_GEOMETRY_BIT:					return glu::SHADERTYPE_GEOMETRY;
		case VK_SHADER_STAGE_FRAGMENT_BIT:					return glu::SHADERTYPE_FRAGMENT;
		case VK_SHADER_STAGE_COMPUTE_BIT:					return glu::SHADERTYPE_COMPUTE;
		default:
			DE_FATAL("Unknown shader stage");
			return glu::SHADERTYPE_LAST;
	}
}